

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner<ncnn::BinaryOp_x86_functor::binary_op_rpow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  __m128 afVar3;
  __m128 _outp_4;
  __m128 _p_4;
  int i_4;
  __m128 _b_128_4;
  float _b_4;
  int y_2;
  float *ptr1_2;
  int z_1;
  int size_4;
  float *outptr_4;
  float *ptr_4;
  int q_3;
  __m128 _outp_3;
  __m128 _p_3;
  int i_3;
  __m128 _b_128_3;
  float _b_3;
  int z;
  int size_3;
  float *outptr_3;
  float *ptr1_1;
  float *ptr_3;
  int q_2;
  __m128 _outp_2;
  __m128 _p_2;
  int i_2;
  __m128 _b_128_2;
  float _b_2;
  int y_1;
  int size_2;
  float *outptr_2;
  float *ptr1;
  float *ptr_2;
  int q_1;
  __m128 _outp_1;
  __m128 _p_1;
  int i_1;
  int size_1;
  __m128 _b_128_1;
  float _b_1;
  float *outptr_1;
  float *ptr_1;
  int q;
  __m128 _outp;
  __m128 _p;
  int i;
  int size;
  __m128 _b_128;
  float _b;
  float *outptr;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rpow op;
  Mat *m_8;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  float *in_stack_fffffffffffff188;
  float *x;
  binary_op_rpow *in_stack_fffffffffffff190;
  binary_op_rpow *this;
  float local_de8 [2];
  float afStack_de0 [22];
  float local_d88 [2];
  float afStack_d80 [22];
  float local_d28 [2];
  float afStack_d20 [22];
  float local_cc8 [2];
  float afStack_cc0 [4];
  undefined8 uStack_cb0;
  float local_ca8 [2];
  float afStack_ca0 [5];
  int local_c8c;
  float *local_c88;
  binary_op_rpow *pbStack_c80;
  undefined4 local_c70;
  int local_c6c;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined4 local_c50;
  long local_c48;
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined8 local_c28;
  long local_c20;
  int local_c18;
  int local_c14;
  undefined8 local_c10;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined4 local_bf8;
  long local_bf0;
  undefined4 local_be8;
  undefined4 local_be4;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined8 local_bd0;
  float *local_bc8;
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined4 local_ba8;
  long local_ba0;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined8 local_b80;
  float *local_b78;
  int local_b6c;
  undefined1 local_b68 [16];
  float local_b58 [2];
  float afStack_b50 [5];
  int local_b3c;
  float local_b38 [2];
  float afStack_b30 [3];
  float local_b24;
  int local_b20;
  int local_b1c;
  undefined8 local_b18;
  undefined8 local_b10;
  undefined8 local_b08;
  undefined4 local_b00;
  long local_af8;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined8 local_ad8;
  float *local_ad0;
  long local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined8 local_ab0;
  undefined4 local_aa8;
  long local_aa0;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined8 local_a80;
  float *local_a78;
  int local_a6c;
  undefined1 local_a68 [16];
  float local_a58 [2];
  float afStack_a50 [5];
  int local_a3c;
  float local_a38 [2];
  float afStack_a30 [3];
  float local_a24;
  int local_a20;
  int local_a1c;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined8 local_a08;
  undefined4 local_a00;
  long local_9f8;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined8 local_9d8;
  float *local_9d0;
  long local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined4 local_9a8;
  long local_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined8 local_980;
  float *local_978;
  int local_96c;
  undefined1 local_968 [16];
  float local_958 [2];
  float afStack_950 [4];
  int local_940;
  int local_93c;
  float local_938 [2];
  float afStack_930 [3];
  float local_924;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined4 local_908;
  long local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  float *local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  long local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  float *local_888;
  int local_87c;
  undefined1 local_878 [16];
  float local_868 [2];
  float afStack_860 [4];
  int local_850;
  int local_84c;
  float local_848 [2];
  float afStack_840 [3];
  float local_834;
  float *local_830;
  float *local_828;
  int local_81c;
  int local_818;
  int local_814;
  int local_810;
  int local_80c;
  int local_808;
  binary_op_rpow local_801 [9];
  long *local_7f8;
  long *local_7f0;
  long *local_7e8;
  long local_7e0;
  long local_7d0;
  long *local_7c8;
  undefined1 local_7bd;
  int local_7bc;
  undefined8 *local_7b0;
  undefined1 local_7a5;
  int local_7a4;
  undefined8 *local_798;
  undefined1 local_78d;
  int local_78c;
  undefined8 *local_780;
  undefined1 local_775;
  int local_774;
  undefined8 *local_768;
  undefined1 local_75d;
  int local_75c;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_728;
  long *local_720;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined1 local_6a5;
  int local_6a4;
  undefined8 *local_698;
  undefined1 local_685;
  int local_684;
  undefined8 *local_678;
  undefined1 local_665;
  int local_664;
  undefined8 *local_658;
  undefined1 local_645;
  int local_644;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined4 local_5f8;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_578;
  long lStack_570;
  undefined4 local_564;
  long local_560;
  float *local_558;
  undefined4 local_54c;
  int local_548;
  int local_544;
  undefined8 *local_540;
  long local_538;
  undefined4 local_52c;
  long local_528;
  float *local_520;
  undefined4 local_514;
  int local_510;
  int local_50c;
  undefined8 *local_508;
  long local_500;
  undefined4 local_4f4;
  long local_4f0;
  float *local_4e8;
  undefined4 local_4dc;
  int local_4d8;
  int local_4d4;
  undefined8 *local_4d0;
  long local_4c8;
  undefined4 local_4bc;
  long local_4b8;
  float *local_4b0;
  undefined4 local_4a4;
  int local_4a0;
  int local_49c;
  undefined8 *local_498;
  long local_490;
  undefined4 local_484;
  long local_480;
  float *local_478;
  undefined4 local_46c;
  int local_468;
  int local_464;
  undefined8 *local_460;
  long local_458;
  undefined4 local_44c;
  long local_448;
  float *local_440;
  undefined4 local_434;
  int local_430;
  int local_42c;
  undefined8 *local_428;
  long local_420;
  undefined4 local_414;
  long local_410;
  float *local_408;
  undefined4 local_3fc;
  int local_3f8;
  int local_3f4;
  undefined8 *local_3f0;
  long local_3e8;
  undefined4 local_3dc;
  long local_3d8;
  float *local_3d0;
  undefined4 local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  long local_3b0;
  undefined4 local_3a4;
  long local_3a0;
  long local_398;
  undefined4 local_38c;
  int local_388;
  int local_384;
  undefined8 *local_380;
  undefined4 local_374;
  long local_370;
  undefined4 local_364;
  long local_360;
  undefined4 local_354;
  long local_350;
  undefined4 local_344;
  long local_340;
  undefined4 local_334;
  long local_330;
  undefined4 local_324;
  long local_320;
  undefined4 local_314;
  long local_310;
  undefined4 local_304;
  long local_300;
  undefined4 local_2f4;
  long local_2f0;
  undefined8 *local_2a0;
  undefined8 *local_290;
  undefined8 *local_280;
  undefined8 *local_270;
  undefined8 *local_260;
  undefined8 *local_250;
  undefined8 *local_240;
  undefined8 *local_230;
  undefined8 *local_220;
  int local_134;
  undefined8 *local_130;
  int local_124;
  int local_114;
  int local_104;
  long *local_100;
  int local_f4;
  long *local_f0;
  float *local_e8;
  undefined8 *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_808 = *(int *)((long)in_RDI + 0x2c);
  local_80c = (int)in_RDI[6];
  local_810 = *(int *)((long)in_RDI + 0x34);
  local_814 = (int)in_RDI[7];
  local_818 = (int)in_RDI[3];
  local_7f8 = in_RDX;
  local_7f0 = in_RSI;
  local_7e8 = in_RDI;
  if (((int)in_RDI[5] == 2) && ((int)in_RSI[5] == 1)) {
    for (local_81c = 0; local_81c < local_80c; local_81c = local_81c + 1) {
      local_100 = local_7e8;
      local_104 = local_81c;
      local_828 = (float *)(*local_7e8 +
                           (long)*(int *)((long)local_7e8 + 0x2c) * (long)local_81c * local_7e8[2]);
      local_f0 = local_7f8;
      local_f4 = local_81c;
      local_830 = (float *)(*local_7f8 +
                           (long)*(int *)((long)local_7f8 + 0x2c) * (long)local_81c * local_7f8[2]);
      local_7d0 = (long)local_81c;
      local_7c8 = local_7f0;
      local_834 = *(float *)(*local_7f0 + local_7d0 * 4);
      if (local_818 == 4) {
        local_720 = local_7f0;
        local_a0 = (float *)(*local_7f0 + (long)(local_81c << 2) * 4);
        local_cc8 = *(float (*) [2])local_a0;
        afStack_cc0._0_8_ = *(undefined8 *)(local_a0 + 2);
      }
      else {
        local_cc8[1] = local_834;
        local_cc8[0] = local_834;
        afStack_cc0[1] = local_834;
        afStack_cc0[0] = local_834;
        local_588 = local_834;
        fStack_584 = local_834;
        fStack_580 = local_834;
        fStack_57c = local_834;
        local_578 = local_834;
      }
      local_848[0] = local_cc8[0];
      local_848[1] = local_cc8[1];
      afStack_840[0] = afStack_cc0[0];
      afStack_840[1] = afStack_cc0[1];
      local_84c = local_808 * local_818;
      for (local_850 = 0; local_850 + 3 < local_84c; local_850 = local_850 + 4) {
        local_a8 = local_828;
        local_868 = *(float (*) [2])local_828;
        afStack_860._0_8_ = *(undefined8 *)(local_828 + 2);
        afVar3 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                           (local_801,(__m128 *)local_868,(__m128 *)local_848);
        local_18 = afVar3._0_8_;
        local_878._8_4_ = extraout_XMM0_Dc;
        local_878._0_8_ = local_18;
        local_878._12_4_ = extraout_XMM0_Dd;
        local_8 = local_830;
        uStack_10 = local_878._8_8_;
        *(undefined8 *)local_830 = local_18;
        *(undefined8 *)(local_830 + 2) = local_878._8_8_;
        local_828 = local_828 + 4;
        local_830 = local_830 + 4;
      }
      for (; local_850 < local_84c; local_850 = local_850 + 1) {
        fVar2 = BinaryOp_x86_functor::binary_op_rpow::func
                          (in_stack_fffffffffffff190,in_stack_fffffffffffff188,(float *)0x1060e43);
        *local_830 = fVar2;
        local_828 = local_828 + 1;
        local_830 = local_830 + 1;
      }
    }
  }
  if ((((int)local_7e8[5] == 3) || ((int)local_7e8[5] == 4)) && ((int)local_7f0[5] == 1)) {
    for (local_87c = 0; local_87c < local_814; local_87c = local_87c + 1) {
      local_750 = &local_8d0;
      local_464 = *(int *)((long)local_7e8 + 0x2c);
      local_468 = (int)local_7e8[6];
      local_46c = *(undefined4 *)((long)local_7e8 + 0x34);
      local_888 = (float *)(*local_7e8 + local_7e8[8] * (long)local_87c * local_7e8[2]);
      local_480 = local_7e8[2];
      local_484 = (undefined4)local_7e8[3];
      local_490 = local_7e8[4];
      local_460 = &local_8d0;
      local_330 = (long)local_464 * (long)local_468 * local_480;
      local_728 = &local_8d0;
      local_6f0 = &local_8d0;
      local_638 = &local_920;
      local_544 = *(int *)((long)local_7f8 + 0x2c);
      local_548 = (int)local_7f8[6];
      local_54c = *(undefined4 *)((long)local_7f8 + 0x34);
      local_8d8 = (float *)(*local_7f8 + local_7f8[8] * (long)local_87c * local_7f8[2]);
      local_560 = local_7f8[2];
      local_564 = (undefined4)local_7f8[3];
      lStack_570 = local_7f8[4];
      local_540 = &local_920;
      local_2f0 = (long)local_544 * (long)local_548 * local_560;
      local_610 = &local_920;
      local_6e8 = &local_920;
      local_898 = 0;
      local_89c = 0;
      local_8a0 = 0;
      local_8a4 = 0;
      local_8b8 = 0;
      local_8c0 = 0;
      local_8c8 = 0;
      local_8d0 = 0;
      local_2f4 = 0x10;
      local_334 = 0x10;
      local_644 = local_87c;
      local_645 = 1;
      local_75c = local_87c;
      local_75d = 1;
      local_890 = 0;
      local_8a8 = 0;
      local_920 = 0;
      local_910 = 0;
      local_908 = 0;
      local_8f8 = 0;
      local_8f4 = 0;
      local_8f0 = 0;
      local_8ec = 0;
      local_8e8 = 0;
      local_8e0 = 0;
      local_918 = 0;
      local_7e0 = (long)local_87c;
      local_924 = *(float *)(*local_7f0 + local_7e0 * 4);
      if (local_818 == 4) {
        local_b0 = (float *)(*local_7f0 + (long)(local_87c << 2) * 4);
        local_d28 = *(float (*) [2])local_b0;
        afStack_d20._0_8_ = *(undefined8 *)(local_b0 + 2);
      }
      else {
        local_d28[1] = local_924;
        local_d28[0] = local_924;
        afStack_d20[1] = local_924;
        afStack_d20[0] = local_924;
        local_5a8 = local_924;
        fStack_5a4 = local_924;
        fStack_5a0 = local_924;
        fStack_59c = local_924;
        local_598 = local_924;
      }
      local_938[0] = local_d28[0];
      local_938[1] = local_d28[1];
      afStack_930[0] = afStack_d20[0];
      afStack_930[1] = afStack_d20[1];
      local_93c = local_808 * local_80c * local_810 * local_818;
      local_558 = local_8d8;
      local_478 = local_888;
      local_230 = local_6e8;
      local_220 = local_6f0;
      local_900 = lStack_570;
      local_8b0 = local_490;
      for (local_940 = 0; local_940 + 3 < local_93c; local_940 = local_940 + 4) {
        local_b8 = local_888;
        local_958 = *(float (*) [2])local_888;
        afStack_950._0_8_ = *(undefined8 *)(local_888 + 2);
        afVar3 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                           (local_801,(__m128 *)local_958,(__m128 *)local_938);
        local_38 = afVar3._0_8_;
        local_968._8_4_ = extraout_XMM0_Dc_00;
        local_968._0_8_ = local_38;
        local_968._12_4_ = extraout_XMM0_Dd_00;
        local_20 = local_8d8;
        uStack_30 = local_968._8_8_;
        *(undefined8 *)local_8d8 = local_38;
        *(undefined8 *)(local_8d8 + 2) = local_968._8_8_;
        local_888 = local_888 + 4;
        local_8d8 = local_8d8 + 4;
      }
      for (; local_940 < local_93c; local_940 = local_940 + 1) {
        fVar2 = BinaryOp_x86_functor::binary_op_rpow::func
                          (in_stack_fffffffffffff190,in_stack_fffffffffffff188,(float *)0x106199c);
        *local_8d8 = fVar2;
        local_888 = local_888 + 1;
        local_8d8 = local_8d8 + 1;
      }
    }
  }
  if (((int)local_7e8[5] == 3) && ((int)local_7f0[5] == 2)) {
    for (local_96c = 0; local_96c < local_814; local_96c = local_96c + 1) {
      local_768 = &local_9c0;
      local_42c = *(int *)((long)local_7e8 + 0x2c);
      local_430 = (int)local_7e8[6];
      local_434 = *(undefined4 *)((long)local_7e8 + 0x34);
      local_978 = (float *)(*local_7e8 + local_7e8[8] * (long)local_96c * local_7e8[2]);
      local_448 = local_7e8[2];
      local_44c = (undefined4)local_7e8[3];
      local_458 = local_7e8[4];
      local_428 = &local_9c0;
      local_340 = (long)local_42c * (long)local_430 * local_448;
      local_738 = &local_9c0;
      local_6e0 = &local_9c0;
      local_9c8 = *local_7f0 +
                  (long)*(int *)((long)local_7f0 + 0x2c) * (long)local_96c * local_7f0[2];
      local_658 = &local_a18;
      local_50c = *(int *)((long)local_7f8 + 0x2c);
      local_510 = (int)local_7f8[6];
      local_514 = *(undefined4 *)((long)local_7f8 + 0x34);
      local_9d0 = (float *)(*local_7f8 + local_7f8[8] * (long)local_96c * local_7f8[2]);
      local_528 = local_7f8[2];
      local_52c = (undefined4)local_7f8[3];
      local_538 = local_7f8[4];
      local_508 = &local_a18;
      local_300 = (long)local_50c * (long)local_510 * local_528;
      local_618 = &local_a18;
      local_6d8 = &local_a18;
      local_988 = 0;
      local_98c = 0;
      local_990 = 0;
      local_994 = 0;
      local_9a8 = 0;
      local_9b0 = 0;
      local_9b8 = 0;
      local_9c0 = 0;
      local_114 = local_96c;
      local_304 = 0x10;
      local_344 = 0x10;
      local_664 = local_96c;
      local_665 = 1;
      local_774 = local_96c;
      local_775 = 1;
      local_980 = 0;
      local_998 = 0;
      local_a18 = 0;
      local_a08 = 0;
      local_a00 = 0;
      local_9f0 = 0;
      local_9ec = 0;
      local_9e8 = 0;
      local_9e4 = 0;
      local_9e0 = 0;
      local_9d8 = 0;
      local_a10 = 0;
      local_a1c = local_808 * local_818;
      local_520 = local_9d0;
      local_440 = local_978;
      local_250 = local_6d8;
      local_240 = local_6e0;
      local_9f8 = local_538;
      local_9a0 = local_458;
      for (local_a20 = 0; local_a20 < local_80c; local_a20 = local_a20 + 1) {
        local_a24 = *(float *)(local_9c8 + (long)local_a20 * 4);
        if (local_818 == 4) {
          local_c0 = (float *)(local_9c8 + (long)(local_a20 << 2) * 4);
          local_d88 = *(float (*) [2])local_c0;
          afStack_d80._0_8_ = *(undefined8 *)(local_c0 + 2);
        }
        else {
          local_d88[1] = local_a24;
          local_d88[0] = local_a24;
          afStack_d80[1] = local_a24;
          afStack_d80[0] = local_a24;
          local_5c8 = local_a24;
          fStack_5c4 = local_a24;
          fStack_5c0 = local_a24;
          fStack_5bc = local_a24;
          local_5b8 = local_a24;
        }
        local_a38[0] = local_d88[0];
        local_a38[1] = local_d88[1];
        afStack_a30[0] = afStack_d80[0];
        afStack_a30[1] = afStack_d80[1];
        for (local_a3c = 0; local_a3c + 3 < local_a1c; local_a3c = local_a3c + 4) {
          local_c8 = local_978;
          local_a58 = *(float (*) [2])local_978;
          afStack_a50._0_8_ = *(undefined8 *)(local_978 + 2);
          afVar3 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                             (local_801,(__m128 *)local_a58,(__m128 *)local_a38);
          local_58 = afVar3._0_8_;
          local_a68._8_4_ = extraout_XMM0_Dc_01;
          local_a68._0_8_ = local_58;
          local_a68._12_4_ = extraout_XMM0_Dd_01;
          local_40 = local_9d0;
          uStack_50 = local_a68._8_8_;
          *(undefined8 *)local_9d0 = local_58;
          *(undefined8 *)(local_9d0 + 2) = local_a68._8_8_;
          local_978 = local_978 + 4;
          local_9d0 = local_9d0 + 4;
        }
        for (; local_a3c < local_a1c; local_a3c = local_a3c + 1) {
          fVar2 = BinaryOp_x86_functor::binary_op_rpow::func
                            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,(float *)0x1062509)
          ;
          *local_9d0 = fVar2;
          local_978 = local_978 + 1;
          local_9d0 = local_9d0 + 1;
        }
      }
    }
  }
  if (((int)local_7e8[5] == 4) && ((int)local_7f0[5] == 2)) {
    for (local_a6c = 0; local_a6c < local_814; local_a6c = local_a6c + 1) {
      local_780 = &local_ac0;
      local_3f4 = *(int *)((long)local_7e8 + 0x2c);
      local_3f8 = (int)local_7e8[6];
      local_3fc = *(undefined4 *)((long)local_7e8 + 0x34);
      local_a78 = (float *)(*local_7e8 + local_7e8[8] * (long)local_a6c * local_7e8[2]);
      local_410 = local_7e8[2];
      local_414 = (undefined4)local_7e8[3];
      local_420 = local_7e8[4];
      local_3f0 = &local_ac0;
      local_350 = (long)local_3f4 * (long)local_3f8 * local_410;
      local_740 = &local_ac0;
      local_6d0 = &local_ac0;
      local_ac8 = *local_7f0 +
                  (long)*(int *)((long)local_7f0 + 0x2c) * (long)local_a6c * local_7f0[2];
      local_678 = &local_b18;
      local_4d4 = *(int *)((long)local_7f8 + 0x2c);
      local_4d8 = (int)local_7f8[6];
      local_4dc = *(undefined4 *)((long)local_7f8 + 0x34);
      local_ad0 = (float *)(*local_7f8 + local_7f8[8] * (long)local_a6c * local_7f8[2]);
      local_4f0 = local_7f8[2];
      local_4f4 = (undefined4)local_7f8[3];
      local_500 = local_7f8[4];
      local_4d0 = &local_b18;
      local_310 = (long)local_4d4 * (long)local_4d8 * local_4f0;
      local_620 = &local_b18;
      local_6c8 = &local_b18;
      local_a88 = 0;
      local_a8c = 0;
      local_a90 = 0;
      local_a94 = 0;
      local_aa8 = 0;
      local_ab0 = 0;
      local_ab8 = 0;
      local_ac0 = 0;
      local_124 = local_a6c;
      local_314 = 0x10;
      local_354 = 0x10;
      local_684 = local_a6c;
      local_685 = 1;
      local_78c = local_a6c;
      local_78d = 1;
      local_a80 = 0;
      local_a98 = 0;
      local_b18 = 0;
      local_b08 = 0;
      local_b00 = 0;
      local_af0 = 0;
      local_aec = 0;
      local_ae8 = 0;
      local_ae4 = 0;
      local_ae0 = 0;
      local_ad8 = 0;
      local_b10 = 0;
      local_b1c = local_808 * local_80c * local_818;
      local_4e8 = local_ad0;
      local_408 = local_a78;
      local_270 = local_6c8;
      local_260 = local_6d0;
      local_af8 = local_500;
      local_aa0 = local_420;
      for (local_b20 = 0; local_b20 < local_810; local_b20 = local_b20 + 1) {
        local_b24 = *(float *)(local_ac8 + (long)local_b20 * 4);
        if (local_818 == 4) {
          local_d0 = (float *)(local_ac8 + (long)(local_b20 << 2) * 4);
          local_de8 = *(float (*) [2])local_d0;
          afStack_de0._0_8_ = *(undefined8 *)(local_d0 + 2);
        }
        else {
          local_de8[1] = local_b24;
          local_de8[0] = local_b24;
          afStack_de0[1] = local_b24;
          afStack_de0[0] = local_b24;
          local_5e8 = local_b24;
          fStack_5e4 = local_b24;
          fStack_5e0 = local_b24;
          fStack_5dc = local_b24;
          local_5d8 = local_b24;
        }
        local_b38[0] = local_de8[0];
        local_b38[1] = local_de8[1];
        afStack_b30[0] = afStack_de0[0];
        afStack_b30[1] = afStack_de0[1];
        for (local_b3c = 0; local_b3c + 3 < local_b1c; local_b3c = local_b3c + 4) {
          local_d8 = local_a78;
          local_b58 = *(float (*) [2])local_a78;
          afStack_b50._0_8_ = *(undefined8 *)(local_a78 + 2);
          afVar3 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                             (local_801,(__m128 *)local_b58,(__m128 *)local_b38);
          local_78 = afVar3._0_8_;
          local_b68._8_4_ = extraout_XMM0_Dc_02;
          local_b68._0_8_ = local_78;
          local_b68._12_4_ = extraout_XMM0_Dd_02;
          local_60 = local_ad0;
          uStack_70 = local_b68._8_8_;
          *(undefined8 *)local_ad0 = local_78;
          *(undefined8 *)(local_ad0 + 2) = local_b68._8_8_;
          local_a78 = local_a78 + 4;
          local_ad0 = local_ad0 + 4;
        }
        for (; local_b3c < local_b1c; local_b3c = local_b3c + 1) {
          fVar2 = BinaryOp_x86_functor::binary_op_rpow::func
                            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,(float *)0x1063096)
          ;
          *local_ad0 = fVar2;
          local_a78 = local_a78 + 1;
          local_ad0 = local_ad0 + 1;
        }
      }
    }
  }
  if (((int)local_7e8[5] == 4) && ((int)local_7f0[5] == 3)) {
    for (local_b6c = 0; local_b6c < local_814; local_b6c = local_b6c + 1) {
      local_798 = &local_bc0;
      local_3bc = *(int *)((long)local_7e8 + 0x2c);
      local_3c0 = (int)local_7e8[6];
      local_3c4 = *(undefined4 *)((long)local_7e8 + 0x34);
      local_b78 = (float *)(*local_7e8 + local_7e8[8] * (long)local_b6c * local_7e8[2]);
      local_3d8 = local_7e8[2];
      local_3dc = (undefined4)local_7e8[3];
      local_3e8 = local_7e8[4];
      local_3b8 = &local_bc0;
      local_360 = (long)local_3bc * (long)local_3c0 * local_3d8;
      local_748 = &local_bc0;
      local_6c0 = &local_bc0;
      local_698 = &local_c10;
      local_49c = *(int *)((long)local_7f8 + 0x2c);
      local_4a0 = (int)local_7f8[6];
      local_4a4 = *(undefined4 *)((long)local_7f8 + 0x34);
      local_bc8 = (float *)(*local_7f8 + local_7f8[8] * (long)local_b6c * local_7f8[2]);
      local_4b8 = local_7f8[2];
      local_4bc = (undefined4)local_7f8[3];
      local_4c8 = local_7f8[4];
      local_498 = &local_c10;
      local_320 = (long)local_49c * (long)local_4a0 * local_4b8;
      local_628 = &local_c10;
      local_6b8 = &local_c10;
      local_b88 = 0;
      local_b8c = 0;
      local_b90 = 0;
      local_b94 = 0;
      local_ba8 = 0;
      local_bb0 = 0;
      local_bb8 = 0;
      local_bc0 = 0;
      local_324 = 0x10;
      local_364 = 0x10;
      local_6a4 = local_b6c;
      local_6a5 = 1;
      local_7a4 = local_b6c;
      local_7a5 = 1;
      local_b80 = 0;
      local_b98 = 0;
      local_c10 = 0;
      local_c00 = 0;
      local_bf8 = 0;
      local_be8 = 0;
      local_be4 = 0;
      local_be0 = 0;
      local_bdc = 0;
      local_bd8 = 0;
      local_bd0 = 0;
      local_c08 = 0;
      local_c14 = local_808 * local_818;
      local_4b0 = local_bc8;
      local_3d0 = local_b78;
      local_290 = local_6b8;
      local_280 = local_6c0;
      local_bf0 = local_4c8;
      local_ba0 = local_3e8;
      for (local_c18 = 0; local_c18 < local_810; local_c18 = local_c18 + 1) {
        local_7b0 = &local_c68;
        local_384 = *(int *)((long)local_7f0 + 0x2c);
        local_388 = (int)local_7f0[6];
        local_38c = *(undefined4 *)((long)local_7f0 + 0x34);
        local_398 = *local_7f0 + local_7f0[8] * (long)local_b6c * local_7f0[2];
        local_3a0 = local_7f0[2];
        local_3a4 = (undefined4)local_7f0[3];
        local_3b0 = local_7f0[4];
        local_380 = &local_c68;
        local_370 = (long)local_384 * (long)local_388 * local_3a0;
        local_130 = &local_c68;
        local_c20 = local_398 + (long)local_384 * (long)local_c18 * local_3a0;
        local_6b0 = &local_c68;
        local_134 = local_c18;
        local_374 = 0x10;
        local_7bc = local_b6c;
        local_7bd = 1;
        local_c68 = 0;
        local_c58 = 0;
        local_c50 = 0;
        local_c40 = 0;
        local_c3c = 0;
        local_c38 = 0;
        local_c34 = 0;
        local_c30 = 0;
        local_c28 = 0;
        local_c60 = 0;
        local_2a0 = local_6b0;
        local_c48 = local_3b0;
        for (local_c6c = 0; local_c6c < local_80c; local_c6c = local_c6c + 1) {
          local_c70 = *(undefined4 *)(local_c20 + (long)local_c6c * 4);
          if (local_818 == 4) {
            local_e0 = (undefined8 *)(local_c20 + (long)(local_c6c << 2) * 4);
            x = (float *)*local_e0;
            this = (binary_op_rpow *)local_e0[1];
          }
          else {
            x = (float *)CONCAT44(local_c70,local_c70);
            this = (binary_op_rpow *)CONCAT44(local_c70,local_c70);
            local_608 = local_c70;
            uStack_604 = local_c70;
            uStack_600 = local_c70;
            uStack_5fc = local_c70;
            local_5f8 = local_c70;
          }
          local_c88 = x;
          pbStack_c80 = this;
          for (local_c8c = 0; local_c8c + 3 < local_c14; local_c8c = local_c8c + 4) {
            local_e8 = local_b78;
            local_ca8 = *(float (*) [2])local_b78;
            afStack_ca0._0_8_ = *(undefined8 *)(local_b78 + 2);
            afVar3 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                               (local_801,(__m128 *)local_ca8,(__m128 *)&local_c88);
            local_98 = afVar3._0_8_;
            auVar1._8_4_ = extraout_XMM0_Dc_03;
            auVar1._0_8_ = local_98;
            auVar1._12_4_ = extraout_XMM0_Dd_03;
            local_80 = local_bc8;
            uStack_cb0 = auVar1._8_8_;
            uStack_90 = uStack_cb0;
            *(undefined8 *)local_bc8 = local_98;
            *(undefined8 *)(local_bc8 + 2) = uStack_cb0;
            local_b78 = local_b78 + 4;
            local_bc8 = local_bc8 + 4;
          }
          for (; local_c8c < local_c14; local_c8c = local_c8c + 1) {
            fVar2 = BinaryOp_x86_functor::binary_op_rpow::func(this,x,(float *)0x1063fc2);
            *local_bc8 = fVar2;
            local_b78 = local_b78 + 1;
            local_bc8 = local_bc8 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2 && b.dims == 1)
    {
        // type 8
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            float* outptr = c.row(y);

            const float _b = b[y];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + y * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if ((a.dims == 3 || a.dims == 4) && b.dims == 1)
    {
        // type 9 11
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const float _b = b[q];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + q * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * h * d * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if (a.dims == 3 && b.dims == 2)
    {
        // type 10
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int y = 0; y < h; y++)
            {
                const float _b = ptr1[y];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 2)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * h * elempack;

            for (int z = 0; z < d; z++)
            {
                const float _b = ptr1[z];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + z * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + z * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + z * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 3)
    {
        // type 13
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int z = 0; z < d; z++)
            {
                const float* ptr1 = b.channel(q).row(z);

                for (int y = 0; y < h; y++)
                {
                    const float _b = ptr1[y];
#if __SSE2__
                    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        __m512 _outp = op.func_pack16(_p, _b_512);
                        _mm512_storeu_ps(outptr, _outp);
                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _outp = op.func_pack8(_p, _b_256);
                        _mm256_storeu_ps(outptr, _outp);
                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        __m128 _outp = op.func_pack4(_p, _b_128);
                        _mm_storeu_ps(outptr, _outp);
                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr = op.func(*ptr, _b);
                        ptr += 1;
                        outptr += 1;
                    }
                }
            }
        }
    }

    return 0;
}